

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_glyphpath_pushPrevElem
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *nextP0,FT_Vector nextP1,
               FT_Bool close)

{
  bool bVar1;
  FT_Pos FVar2;
  FT_Vector *pFVar3;
  int iVar4;
  int iVar5;
  FT_Long FVar6;
  long lVar7;
  int iVar8;
  CF2_F16Dot16 CVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  CF2_HintMap hintmap_00;
  ulong uVar13;
  CF2_F16Dot16 CVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  FT_Vector *pFVar18;
  ulong uVar19;
  bool bVar20;
  CF2_CallbackParamsRec params;
  FT_Pos local_a8;
  CF2_CallbackParamsRec_ local_78;
  
  bVar20 = glyphpath->prevElemOp != 2;
  pFVar18 = &glyphpath->prevElemP3;
  pFVar3 = &glyphpath->prevElemP2;
  if (!bVar20) {
    pFVar18 = &glyphpath->prevElemP1;
    pFVar3 = &glyphpath->prevElemP0;
  }
  uVar19 = (ulong)bVar20;
  uVar13 = uVar19 * 0x20;
  lVar15 = (&glyphpath->prevElemP1)[uVar19 * 2].x;
  if ((lVar15 == nextP0->x) && (pFVar18->y == nextP0->y)) {
    bVar20 = true;
    local_a8 = 0;
    lVar15 = 0;
  }
  else {
    uVar19 = uVar13 | 0x4980;
    uVar13 = uVar13 | 0x4990;
    iVar10 = *(int *)((long)(glyphpath->hintMap).edge + (uVar19 - 0x38));
    iVar11 = (int)pFVar3->y;
    iVar4 = (int)nextP0->x;
    iVar5 = (int)nextP0->y;
    lVar12 = (long)(((int)nextP1.y - iVar5) + 0x10 >> 5);
    lVar7 = (((int)lVar15 - iVar10) + 0x10 >> 5) * lVar12;
    lVar15 = (long)(((int)nextP1.x - iVar4) + 0x10 >> 5);
    lVar17 = (((int)pFVar18->y - iVar11) + 0x10 >> 5) * lVar15;
    bVar20 = true;
    iVar8 = (int)((ulong)(lVar7 + 0x8000 + (lVar7 >> 0x3f)) >> 0x10);
    iVar16 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10);
    if (iVar8 == iVar16) {
      local_a8 = 0;
      lVar15 = 0;
      bVar1 = true;
    }
    else {
      lVar12 = lVar12 * ((iVar4 - iVar10) + 0x10 >> 5);
      lVar15 = ((iVar5 - iVar11) + 0x10 >> 5) * lVar15;
      FVar6 = FT_DivFix((long)((int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10) -
                              (int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10)),
                        (long)(iVar8 - iVar16));
      lVar15 = *(long *)((long)(glyphpath->hintMap).edge + (uVar19 - 0x38));
      lVar7 = *(long *)((long)(glyphpath->hintMap).edge + (uVar13 - 0x38));
      iVar4 = (int)lVar7;
      lVar12 = (long)(iVar4 - (int)lVar15) * (long)(int)FVar6;
      iVar10 = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      local_a8 = (FT_Pos)(iVar10 + (int)lVar15);
      lVar12 = pFVar3->y;
      iVar5 = (int)pFVar18->y;
      lVar17 = (long)(iVar5 - (int)lVar12) * (long)(int)FVar6;
      iVar11 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10);
      if (lVar7 == lVar15) {
        iVar8 = -iVar10;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        if (iVar8 < glyphpath->snapThreshold) {
          local_a8 = lVar15;
        }
      }
      lVar15 = (long)(iVar11 + (int)lVar12);
      if (pFVar18->y == lVar12) {
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        if (iVar10 < glyphpath->snapThreshold) {
          lVar15 = lVar12;
        }
      }
      lVar7 = nextP0->x;
      if (lVar7 == nextP1.x) {
        iVar11 = (int)local_a8 - (int)lVar7;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        if (iVar10 < glyphpath->snapThreshold) {
          local_a8 = lVar7;
        }
      }
      lVar12 = nextP0->y;
      if (lVar12 == nextP1.y) {
        iVar11 = (int)lVar15 - (int)lVar12;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        if (iVar10 < glyphpath->snapThreshold) {
          lVar15 = lVar12;
        }
      }
      lVar17 = local_a8 - ((int)lVar7 + iVar4) / 2;
      lVar7 = lVar17 * -0x100000000 >> 0x20;
      if (-1 < lVar17) {
        lVar7 = lVar17;
      }
      if (glyphpath->miterLimit < lVar7) {
        bVar1 = true;
      }
      else {
        lVar12 = lVar15 - ((int)lVar12 + iVar5) / 2;
        lVar7 = lVar12 * -0x100000000 >> 0x20;
        if (-1 < lVar12) {
          lVar7 = lVar12;
        }
        bVar1 = glyphpath->miterLimit < lVar7;
      }
    }
    if (!bVar1) {
      *(FT_Pos *)((long)(glyphpath->hintMap).edge + (uVar13 - 0x38)) = local_a8;
      pFVar18->y = lVar15;
      bVar20 = false;
    }
  }
  pFVar3 = &glyphpath->currentDS;
  local_78.pt0.x = (glyphpath->currentDS).x;
  local_78.pt0.y = (glyphpath->currentDS).y;
  if (glyphpath->prevElemOp == 4) {
    local_78.op = 4;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&local_78.pt1,(CF2_F16Dot16)(glyphpath->prevElemP1).x,
               (CF2_F16Dot16)(glyphpath->prevElemP1).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&local_78.pt2,(CF2_F16Dot16)(glyphpath->prevElemP2).x,
               (CF2_F16Dot16)(glyphpath->prevElemP2).y);
    pFVar18 = &local_78.pt3;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,pFVar18,(CF2_F16Dot16)(glyphpath->prevElemP3).x,
               (CF2_F16Dot16)(glyphpath->prevElemP3).y);
    lVar7 = 0x18;
  }
  else {
    if (glyphpath->prevElemOp != 2) goto LAB_0015616f;
    local_78.op = 2;
    if (close == '\0') {
      CVar9 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar14 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = hintmap;
    }
    else {
      CVar9 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar14 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = &glyphpath->firstHintMap;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap_00,&local_78.pt1,CVar9,CVar14);
    pFVar18 = &local_78.pt1;
    lVar7 = 8;
    if ((local_78.pt0.x == local_78.pt1.x) && (local_78.pt0.y == local_78.pt1.y)) goto LAB_0015616f;
  }
  (**(code **)((long)&glyphpath->callbacks->moveTo + lVar7))(glyphpath->callbacks,&local_78);
  FVar2 = pFVar18->y;
  pFVar3->x = pFVar18->x;
  (glyphpath->currentDS).y = FVar2;
LAB_0015616f:
  if (!(bool)(close == '\0' & (bVar20 ^ 1U))) {
    if (close == '\0') {
      CVar9 = (CF2_F16Dot16)nextP0->x;
      CVar14 = (CF2_F16Dot16)nextP0->y;
    }
    else {
      hintmap = &glyphpath->firstHintMap;
      CVar9 = (CF2_F16Dot16)nextP0->x;
      CVar14 = (CF2_F16Dot16)nextP0->y;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap,&local_78.pt1,CVar9,CVar14);
    if ((local_78.pt1.x != pFVar3->x) || (local_78.pt1.y != (glyphpath->currentDS).y)) {
      local_78.op = 2;
      local_78.pt0.x = pFVar3->x;
      local_78.pt0.y = (glyphpath->currentDS).y;
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,&local_78);
      pFVar3->x = local_78.pt1.x;
      (glyphpath->currentDS).y = local_78.pt1.y;
    }
  }
  if (!bVar20) {
    nextP0->x = local_a8;
    nextP0->y = lVar15;
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_pushPrevElem( CF2_GlyphPath  glyphpath,
                              CF2_HintMap    hintmap,
                              FT_Vector*     nextP0,
                              FT_Vector      nextP1,
                              FT_Bool        close )
  {
    CF2_CallbackParamsRec  params;

    FT_Vector*  prevP0;
    FT_Vector*  prevP1;

    FT_Vector  intersection    = { 0, 0 };
    FT_Bool    useIntersection = FALSE;


    FT_ASSERT( glyphpath->prevElemOp == CF2_PathOpLineTo ||
               glyphpath->prevElemOp == CF2_PathOpCubeTo );

    if ( glyphpath->prevElemOp == CF2_PathOpLineTo )
    {
      prevP0 = &glyphpath->prevElemP0;
      prevP1 = &glyphpath->prevElemP1;
    }
    else
    {
      prevP0 = &glyphpath->prevElemP2;
      prevP1 = &glyphpath->prevElemP3;
    }

    /* optimization: if previous and next elements are offset by the same */
    /* amount, then there will be no gap, and no need to compute an       */
    /* intersection.                                                      */
    if ( prevP1->x != nextP0->x || prevP1->y != nextP0->y )
    {
      /* previous element does not join next element:             */
      /* adjust end point of previous element to the intersection */
      useIntersection = cf2_glyphpath_computeIntersection( glyphpath,
                                                           prevP0,
                                                           prevP1,
                                                           nextP0,
                                                           &nextP1,
                                                           &intersection );
      if ( useIntersection )
      {
        /* modify the last point of the cached element (either line or */
        /* curve)                                                      */
        *prevP1 = intersection;
      }
    }

    params.pt0 = glyphpath->currentDS;

    switch( glyphpath->prevElemOp )
    {
    case CF2_PathOpLineTo:
      params.op = CF2_PathOpLineTo;

      /* note: pt2 and pt3 are unused */

      if ( close )
      {
        /* use first hint map if closing */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }

      /* output only non-zero length lines */
      if ( params.pt0.x != params.pt1.x || params.pt0.y != params.pt1.y )
      {
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
      break;

    case CF2_PathOpCubeTo:
      params.op = CF2_PathOpCubeTo;

      /* TODO: should we intersect the interior joins (p1-p2 and p2-p3)? */
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt1,
                               glyphpath->prevElemP1.x,
                               glyphpath->prevElemP1.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt2,
                               glyphpath->prevElemP2.x,
                               glyphpath->prevElemP2.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt3,
                               glyphpath->prevElemP3.x,
                               glyphpath->prevElemP3.y );

      glyphpath->callbacks->cubeTo( glyphpath->callbacks, &params );

      glyphpath->currentDS = params.pt3;

      break;
    }

    if ( !useIntersection || close )
    {
      /* insert connecting line between end of previous element and start */
      /* of current one                                                   */
      /* note: at the end of a subpath, we might do both, so use `nextP0' */
      /* before we change it, below                                       */

      if ( close )
      {
        /* if we are closing the subpath, then nextP0 is in the first     */
        /* hint zone                                                      */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }

      if ( params.pt1.x != glyphpath->currentDS.x ||
           params.pt1.y != glyphpath->currentDS.y )
      {
        /* length is nonzero */
        params.op  = CF2_PathOpLineTo;
        params.pt0 = glyphpath->currentDS;

        /* note: pt2 and pt3 are unused */
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
    }

    if ( useIntersection )
    {
      /* return intersection point to caller */
      *nextP0 = intersection;
    }
  }